

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFileControl(sqlite3_file *id,int op,void *pArg)

{
  long nMap;
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  int *piVar7;
  uint *puVar8;
  long lVar9;
  sqlite3_io_methods *psVar10;
  long lVar11;
  long iOff;
  long lVar12;
  bool bVar13;
  stat buf;
  undefined1 local_c0 [8];
  _func_int_sqlite3_file_ptr *local_b8;
  long local_90;
  int local_88;
  
  iVar4 = 0xc;
  switch(op) {
  case 1:
    uVar5 = (uint)*(byte *)((long)&id[3].pMethods + 4);
    goto LAB_00146b93;
  case 4:
    uVar5 = *(uint *)&id[4].pMethods;
    goto LAB_00146b93;
  case 5:
    nMap = *pArg;
    if (0 < *(int *)&id[9].pMethods) {
      iVar4 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,local_c0);
      if (iVar4 == 0) {
        lVar11 = nMap + *(int *)&id[9].pMethods + -1;
        lVar11 = lVar11 - lVar11 % (long)*(int *)&id[9].pMethods;
        iVar4 = 0x30a;
        bVar13 = true;
        if (local_90 < lVar11) {
          lVar9 = (long)local_88;
          iOff = local_90 + lVar9 + ~(local_90 % lVar9);
          lVar12 = lVar9 + lVar11 + -1;
          if (iOff < lVar12) {
            do {
              if (lVar11 <= iOff) {
                iOff = lVar11 + -1;
              }
              iVar3 = seekAndWriteFd(*(int *)&id[3].pMethods,iOff,"",1,(int *)(id + 4));
              bVar13 = iVar3 == 1;
            } while ((bVar13) && (iOff = iOff + lVar9, iOff < lVar12));
          }
        }
      }
      else {
        iVar4 = 0x70a;
        bVar13 = false;
      }
      if (!bVar13) {
        return iVar4;
      }
    }
    iVar4 = 0;
    if ((0 < (long)id[0xc].pMethods) && ((long)id[10].pMethods < nMap)) {
      if (*(int *)&id[9].pMethods < 1) {
        uVar5 = *(uint *)&id[3].pMethods;
        do {
          iVar4 = (*aSyscall[6].pCurrent)((ulong)uVar5,nMap);
          if (-1 < iVar4) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        if (iVar4 != 0) {
          puVar8 = (uint *)__errno_location();
          *(uint *)&id[4].pMethods = *puVar8;
          psVar10 = id[7].pMethods;
          if (psVar10 == (sqlite3_io_methods *)0x0) {
            psVar10 = (sqlite3_io_methods *)0x1fb931;
          }
          sqlite3_log(0x60a,"os_unix.c:%d: (%d) %s(%s) - %s",0x8e2a,(ulong)*puVar8,"ftruncate",
                      psVar10,"");
          return 0x60a;
        }
      }
      iVar4 = unixMapfile((unixFile *)id,nMap);
    }
    break;
  case 6:
    *(undefined4 *)&id[9].pMethods = *pArg;
    goto LAB_00146c71;
  case 10:
    if (*pArg < 0) {
      uVar1 = *(ushort *)((long)&id[3].pMethods + 6) >> 2;
      goto LAB_00146b90;
    }
    uVar1 = *(ushort *)((long)&id[3].pMethods + 6);
    if (*pArg == 0) {
      uVar1 = uVar1 & 0xfffb;
    }
    else {
      uVar1 = uVar1 | 4;
    }
LAB_00146c6d:
    *(ushort *)((long)&id[3].pMethods + 6) = uVar1;
    goto LAB_00146c71;
  case 0xc:
    iVar4 = 0;
    pcVar6 = sqlite3_mprintf("%s",(id[1].pMethods)->xWrite);
    *(char **)pArg = pcVar6;
    break;
  case 0xd:
    if (-1 < *pArg) {
      uVar1 = *(ushort *)((long)&id[3].pMethods + 6);
      if (*pArg == 0) {
        uVar1 = uVar1 & 0xffef;
      }
      else {
        uVar1 = uVar1 | 0x10;
      }
      goto LAB_00146c6d;
    }
    uVar1 = *(ushort *)((long)&id[3].pMethods + 6) >> 4;
LAB_00146b90:
    uVar5 = uVar1 & 1;
LAB_00146b93:
    *(uint *)pArg = uVar5;
LAB_00146c71:
    iVar4 = 0;
    break;
  case 0x10:
    iVar3 = *(int *)&(id[1].pMethods)->xClose;
    iVar2 = sqlite3_initialize();
    iVar4 = 0;
    if (iVar2 == 0) {
      pcVar6 = (char *)sqlite3Malloc((long)iVar3);
    }
    else {
      pcVar6 = (char *)0x0;
    }
    if (pcVar6 != (char *)0x0) {
      unixGetTempname(*(int *)&(id[1].pMethods)->xClose,pcVar6);
      *(char **)pArg = pcVar6;
    }
    break;
  case 0x12:
    psVar10 = (sqlite3_io_methods *)sqlite3Config.mxMmap;
    if ((long)*pArg < sqlite3Config.mxMmap) {
      psVar10 = *pArg;
    }
    *(sqlite3_io_methods **)pArg = id[0xc].pMethods;
    iVar4 = 0;
    if ((((-1 < (long)psVar10) && (psVar10 != id[0xc].pMethods)) &&
        (*(int *)((long)&id[9].pMethods + 4) == 0)) &&
       (id[0xc].pMethods = psVar10, 0 < (long)id[10].pMethods)) {
      if (id[0xd].pMethods != (sqlite3_io_methods *)0x0) {
        (*aSyscall[0x17].pCurrent)(id[0xd].pMethods,id[0xb].pMethods);
        id[0xd].pMethods = (sqlite3_io_methods *)0x0;
        id[10].pMethods = (sqlite3_io_methods *)0x0;
        id[0xb].pMethods = (sqlite3_io_methods *)0x0;
      }
      iVar4 = unixMapfile((unixFile *)id,-1);
      return iVar4;
    }
    break;
  case 0x14:
    iVar4 = 0;
    uVar5 = 0;
    if (id[2].pMethods != (sqlite3_io_methods *)0x0) {
      iVar3 = (*aSyscall[4].pCurrent)(id[7].pMethods,local_c0);
      uVar5 = 1;
      if (iVar3 == 0) {
        uVar5 = (uint)(local_b8 != (id[2].pMethods)->xClose);
      }
    }
    *(uint *)pArg = uVar5;
  }
  return iVar4;
}

Assistant:

static int unixFileControl(sqlite3_file *id, int op, void *pArg){
  unixFile *pFile = (unixFile*)id;
  switch( op ){
#if defined(__linux__) && defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    case SQLITE_FCNTL_BEGIN_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_START_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_BEGIN_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_COMMIT_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_COMMIT_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_COMMIT_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_ROLLBACK_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_ABORT_VOLATILE_WRITE);
      return rc ? SQLITE_IOERR_ROLLBACK_ATOMIC : SQLITE_OK;
    }
#endif /* __linux__ && SQLITE_ENABLE_BATCH_ATOMIC_WRITE */

    case SQLITE_FCNTL_LOCKSTATE: {
      *(int*)pArg = pFile->eFileLock;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_LAST_ERRNO: {
      *(int*)pArg = pFile->lastErrno;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_CHUNK_SIZE: {
      pFile->szChunk = *(int *)pArg;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_SIZE_HINT: {
      int rc;
      SimulateIOErrorBenign(1);
      rc = fcntlSizeHint(pFile, *(i64 *)pArg);
      SimulateIOErrorBenign(0);
      return rc;
    }
    case SQLITE_FCNTL_PERSIST_WAL: {
      unixModeBit(pFile, UNIXFILE_PERSIST_WAL, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_POWERSAFE_OVERWRITE: {
      unixModeBit(pFile, UNIXFILE_PSOW, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_VFSNAME: {
      *(char**)pArg = sqlite3_mprintf("%s", pFile->pVfs->zName);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_TEMPFILENAME: {
      char *zTFile = sqlite3_malloc64( pFile->pVfs->mxPathname );
      if( zTFile ){
        unixGetTempname(pFile->pVfs->mxPathname, zTFile);
        *(char**)pArg = zTFile;
      }
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_HAS_MOVED: {
      *(int*)pArg = fileHasMoved(pFile);
      return SQLITE_OK;
    }
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    case SQLITE_FCNTL_LOCK_TIMEOUT: {
      pFile->iBusyTimeout = *(int*)pArg;
      return SQLITE_OK;
    }
#endif
#if SQLITE_MAX_MMAP_SIZE>0
    case SQLITE_FCNTL_MMAP_SIZE: {
      i64 newLimit = *(i64*)pArg;
      int rc = SQLITE_OK;
      if( newLimit>sqlite3GlobalConfig.mxMmap ){
        newLimit = sqlite3GlobalConfig.mxMmap;
      }

      /* The value of newLimit may be eventually cast to (size_t) and passed
      ** to mmap(). Restrict its value to 2GB if (size_t) is not at least a
      ** 64-bit type. */
      if( newLimit>0 && sizeof(size_t)<8 ){
        newLimit = (newLimit & 0x7FFFFFFF);
      }

      *(i64*)pArg = pFile->mmapSizeMax;
      if( newLimit>=0 && newLimit!=pFile->mmapSizeMax && pFile->nFetchOut==0 ){
        pFile->mmapSizeMax = newLimit;
        if( pFile->mmapSize>0 ){
          unixUnmapfile(pFile);
          rc = unixMapfile(pFile, -1);
        }
      }
      return rc;
    }
#endif
#ifdef SQLITE_DEBUG
    /* The pager calls this method to signal that it has done
    ** a rollback and that the database is therefore unchanged and
    ** it hence it is OK for the transaction change counter to be
    ** unchanged.
    */
    case SQLITE_FCNTL_DB_UNCHANGED: {
      ((unixFile*)id)->dbUpdate = 0;
      return SQLITE_OK;
    }
#endif
#if SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__)
    case SQLITE_FCNTL_SET_LOCKPROXYFILE:
    case SQLITE_FCNTL_GET_LOCKPROXYFILE: {
      return proxyFileControl(id,op,pArg);
    }
#endif /* SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__) */
  }
  return SQLITE_NOTFOUND;
}